

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vptestmd_(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  Int32 IVar4;
  undefined8 uVar5;
  
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
LAB_001254bd:
    failDecode(pMyDisasm);
    return;
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar2 == '\x02') {
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
      builtin_strncpy(pcVar1,"vptestnmq",10);
    }
    else {
      builtin_strncpy(pcVar1,"vptestnmd",10);
    }
  }
  else {
    if (UVar2 != '\x01') goto LAB_001254bd;
    if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
      uVar5 = 0x716d747365747076;
    }
    else {
      uVar5 = 0x646d747365747076;
    }
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar5;
    (pMyDisasm->Instruction).Mnemonic[8] = '\0';
  }
  (pMyDisasm->Reserved_).EVEX.masking = '\x01';
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
  (pMyDisasm->Instruction).Category = 0x140000;
  (pMyDisasm->Reserved_).Register_ = 0x400;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  UVar2 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar2 == '\0') {
    IVar4 = 0xd1;
    IVar3 = 4;
  }
  else if (UVar2 == '\x01') {
    IVar4 = 0xd2;
    IVar3 = 8;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_00125576;
    IVar4 = 0xd6;
    IVar3 = 0x10;
  }
  (pMyDisasm->Reserved_).Register_ = IVar3;
  (pMyDisasm->Reserved_).MemDecoration = IVar4;
LAB_00125576:
  fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
               ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand2,pMyDisasm);
  decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ vptestmd_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vptestmq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vptestmd");
        #endif
      }
      GV.EVEX.tupletype = FULL;
      GV.EVEX.masking = MERGING;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.Register_ = OPMASK_REG;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3_m128_xmm;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
        GV.MemDecoration = Arg3_m256_ymm;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
        GV.MemDecoration = Arg3_m512_zmm;
      }
      fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
      decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else if (GV.VEX.pp == 2) {
      if (GV.EVEX.W == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vptestnmq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vptestnmd");
        #endif
      }
      GV.EVEX.tupletype = FULL;
      GV.EVEX.masking = MERGING;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.Register_ = OPMASK_REG;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3_m128_xmm;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
        GV.MemDecoration = Arg3_m256_ymm;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
        GV.MemDecoration = Arg3_m512_zmm;
      }
      fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
      decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}